

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O2

ChVector<double> *
chrono::Quat_to_Angle
          (ChVector<double> *__return_storage_ptr__,AngleSet angset,ChQuaternion<double> *mquat)

{
  ChMatrix33<double> Acoord;
  ChVector<double> local_78;
  ChMatrix33<double> local_58;
  
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  ChMatrix33<double>::Set_A_quaternion(&local_58,mquat);
  switch(angset) {
  case EULERO:
    ChMatrix33<double>::Get_A_Eulero(&local_78,&local_58);
    break;
  case CARDANO:
    ChMatrix33<double>::Get_A_Cardano(&local_78,&local_58);
    break;
  case HPB:
    ChMatrix33<double>::Get_A_Hpb(&local_78,&local_58);
    break;
  case RXYZ:
    ChMatrix33<double>::Get_A_Rxyz(&local_78,&local_58);
    break;
  case RODRIGUEZ:
    ChMatrix33<double>::Get_A_Rodriguez(&local_78,&local_58);
    break;
  default:
    goto switchD_00a39995_default;
  }
  if (&local_78 != __return_storage_ptr__) {
    __return_storage_ptr__->m_data[0] = local_78.m_data[0];
    __return_storage_ptr__->m_data[1] = local_78.m_data[1];
    __return_storage_ptr__->m_data[2] = local_78.m_data[2];
  }
switchD_00a39995_default:
  return __return_storage_ptr__;
}

Assistant:

ChVector<double> Quat_to_Angle(AngleSet angset, const ChQuaternion<double>& mquat) {
    ChVector<double> res;
    ChMatrix33<> Acoord(mquat);

    switch (angset) {
        case AngleSet::EULERO:
            res = Acoord.Get_A_Eulero();
            break;
        case AngleSet::CARDANO:
            res = Acoord.Get_A_Cardano();
            break;
        case AngleSet::HPB:
            res = Acoord.Get_A_Hpb();
            break;
        case AngleSet::RXYZ:
            res = Acoord.Get_A_Rxyz();
            break;
        case AngleSet::RODRIGUEZ:
            res = Acoord.Get_A_Rodriguez();
            break;
        default:
            break;
    }
    return res;
}